

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

void objc_registerProtocol(Protocol *proto)

{
  Protocol *pPVar1;
  mutex_t *local_18;
  mutex_t *lock_pointer3;
  Protocol *proto_local;
  
  if (proto != (Protocol *)0x0) {
    local_18 = &protocol_table_lock;
    lock_pointer3 = (mutex_t *)proto;
    pthread_mutex_lock((pthread_mutex_t *)&protocol_table_lock);
    pPVar1 = objc_getProtocol(*(char **)&(lock_pointer3->__data).__owner);
    if ((pPVar1 == (Protocol *)0x0) &&
       ((objc_class *)lock_pointer3->__align == &_OBJC_CLASS___IncompleteProtocol)) {
      lock_pointer3->__align = (long)&_OBJC_CLASS_Protocol;
      protocol_table_insert((objc_protocol *)&lock_pointer3->__data);
    }
    objc_release_lock(&local_18);
  }
  return;
}

Assistant:

void objc_registerProtocol(Protocol *proto)
{
	if (NULL == proto) { return; }
	LOCK_FOR_SCOPE(&protocol_table_lock);
	if (objc_getProtocol(proto->name) != NULL) { return; }
	if (proto->isa != (id)&_OBJC_CLASS___IncompleteProtocol) { return; }
	proto->isa = (id)&_OBJC_CLASS_Protocol;
	protocol_table_insert(proto);
}